

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

Session * __thiscall FIX::Acceptor::getSession(Acceptor *this,string *msg,Responder *responder)

{
  Header *this_00;
  bool bVar1;
  iterator iVar2;
  _Rb_tree_header *p_Var3;
  MsgType msgType;
  TargetCompID clTargetCompID;
  SenderCompID clSenderCompID;
  BeginString beginString;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  Message message;
  SessionID sessionID;
  allocator<char> local_541;
  string local_540;
  FieldBase local_520;
  FieldBase local_4c0;
  FieldBase local_460;
  FieldBase local_400;
  FieldBase local_3a0;
  FieldBase local_340;
  Message local_2e0;
  SessionID local_188;
  
  Message::Message(&local_2e0);
  bVar1 = Message::setStringHeader(&local_2e0,msg);
  if (!bVar1) {
    responder = (Responder *)0x0;
    goto LAB_001654d7;
  }
  BeginString::BeginString((BeginString *)&local_400);
  SenderCompID::SenderCompID((SenderCompID *)&local_460);
  TargetCompID::TargetCompID((TargetCompID *)&local_4c0);
  MsgType::MsgType((MsgType *)&local_520);
  this_00 = &local_2e0.m_header;
  FieldMap::getField(&this_00->super_FieldMap,&local_400);
  FieldMap::getField(&this_00->super_FieldMap,&local_460);
  FieldMap::getField(&this_00->super_FieldMap,&local_4c0);
  FieldMap::getField(&this_00->super_FieldMap,&local_520);
  bVar1 = std::operator!=(&local_520.m_string,"A");
  if (bVar1) {
LAB_001654a3:
    responder = (Responder *)0x0;
  }
  else {
    SenderCompID::SenderCompID((SenderCompID *)&local_340,&local_4c0.m_string);
    TargetCompID::TargetCompID((TargetCompID *)&local_3a0,&local_460.m_string);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"",&local_541);
    SessionID::SessionID
              (&local_188,&local_400.m_string,&local_340.m_string,&local_3a0.m_string,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    iVar2 = std::
            _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
            ::find(&(this->m_sessions)._M_t,&local_188);
    p_Var3 = &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar2._M_node != p_Var3) {
      Session::setResponder((Session *)iVar2._M_node[0xc]._M_parent,responder);
      responder = (Responder *)iVar2._M_node[0xc]._M_parent;
    }
    SessionID::~SessionID(&local_188);
    FieldBase::~FieldBase(&local_3a0);
    FieldBase::~FieldBase(&local_340);
    if ((_Rb_tree_header *)iVar2._M_node == p_Var3) goto LAB_001654a3;
  }
  FieldBase::~FieldBase(&local_520);
  FieldBase::~FieldBase(&local_4c0);
  FieldBase::~FieldBase(&local_460);
  FieldBase::~FieldBase(&local_400);
LAB_001654d7:
  Message::~Message(&local_2e0);
  return (Session *)responder;
}

Assistant:

Session* Acceptor::getSession
( const std::string& msg, Responder& responder )
{
  Message message;
  if ( !message.setStringHeader( msg ) )
    return 0;

  BeginString beginString;
  SenderCompID clSenderCompID;
  TargetCompID clTargetCompID;
  MsgType msgType;
  try
  {
    message.getHeader().getField( beginString );
    message.getHeader().getField( clSenderCompID );
    message.getHeader().getField( clTargetCompID );
    message.getHeader().getField( msgType );
    if ( msgType != "A" ) return 0;

    SenderCompID senderCompID( clTargetCompID );
    TargetCompID targetCompID( clSenderCompID );
    SessionID sessionID( beginString, senderCompID, targetCompID );

    Sessions::iterator i = m_sessions.find( sessionID );
    if ( i != m_sessions.end() )
    {
      i->second->setResponder( &responder );
      return i->second;
    }
  }
  catch ( FieldNotFound& ) {}
  return 0;
}